

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void __thiscall asl::Log::storeState(Log *this)

{
  String *pSVar1;
  String local_58;
  int local_2c;
  undefined1 local_28 [4];
  int flags;
  String value;
  Log *this_local;
  
  value.field_2._8_8_ = this;
  asl::String::String((String *)local_28);
  local_2c = (this->_usefile & 1) + (this->_useconsole & 1) * 2;
  pSVar1 = asl::String::operator<<((String *)local_28,(char)this->_maxLevel + '0');
  pSVar1 = asl::String::operator<<(pSVar1,(char)local_2c + '0');
  asl::String::operator<<(pSVar1,&this->_logfile);
  asl::String::String(&local_58,"ASL_LOG");
  Process::setEnv(&local_58,(String *)local_28);
  asl::String::~String(&local_58);
  asl::String::~String((String *)local_28);
  return;
}

Assistant:

void Log::storeState()
{
#ifndef __ANDROID_API__
	String value;
	int flags = (_usefile ? 1 : 0) | (_useconsole ? 2 : 0);
	value << char(_maxLevel + '0') << char(flags + '0') << _logfile;
	Process::setEnv("ASL_LOG", value);
#endif
}